

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

U32 HUF_setMaxHeight(nodeElt *huffNode,U32 lastNonNull,U32 maxNbBits)

{
  byte bVar1;
  BYTE BVar2;
  uint uVar3;
  bool bVar4;
  U32 lowTotal;
  U32 highTotal;
  U32 lowPos;
  U32 highPos;
  U32 nBitsToDecrease;
  int pos;
  U32 currentNbBits;
  U32 rankLast [14];
  U32 local_30;
  U32 noSymbol;
  int n;
  U32 baseCost;
  int totalCost;
  U32 largestBits;
  U32 maxNbBits_local;
  U32 lastNonNull_local;
  nodeElt *huffNode_local;
  
  bVar1 = huffNode[lastNonNull].nbBits;
  huffNode_local._4_4_ = (U32)bVar1;
  if (maxNbBits < huffNode_local._4_4_) {
    n = 0;
    BVar2 = (BYTE)maxNbBits;
    local_30 = lastNonNull;
    while (maxNbBits < huffNode[(int)local_30].nbBits) {
      n = ((1 << (bVar1 - BVar2 & 0x1f)) - (1 << (bVar1 - huffNode[(int)local_30].nbBits & 0x1f))) +
          n;
      huffNode[(int)local_30].nbBits = BVar2;
      local_30 = local_30 - 1;
    }
    while (huffNode[(int)local_30].nbBits == maxNbBits) {
      local_30 = local_30 - 1;
    }
    n = n >> (bVar1 - BVar2 & 0x1f);
    memset(&pos,0xf0,0x38);
    nBitsToDecrease = maxNbBits;
    for (highPos = local_30; -1 < (int)highPos; highPos = highPos - 1) {
      if (huffNode[(int)highPos].nbBits < nBitsToDecrease) {
        nBitsToDecrease = (U32)huffNode[(int)highPos].nbBits;
        (&pos)[maxNbBits - nBitsToDecrease] = highPos;
      }
    }
    while (0 < n) {
      uVar3 = BIT_highbit32(n);
      for (lowPos = uVar3 + 1; 1 < lowPos; lowPos = lowPos - 1) {
        if (((&pos)[lowPos] != 0xf0f0f0f0) &&
           (((&pos)[lowPos - 1] == 0xf0f0f0f0 ||
            (huffNode[(uint)(&pos)[lowPos]].count <= huffNode[(uint)(&pos)[lowPos - 1]].count << 1))
           )) break;
      }
      while( true ) {
        bVar4 = false;
        if (lowPos < 0xd) {
          bVar4 = (&pos)[lowPos] == -0xf0f0f10;
        }
        if (!bVar4) break;
        lowPos = lowPos + 1;
      }
      n = n - (1 << ((char)lowPos - 1U & 0x1f));
      huffNode[(uint)(&pos)[lowPos]].nbBits = huffNode[(uint)(&pos)[lowPos]].nbBits + '\x01';
      if ((&pos)[lowPos - 1] == -0xf0f0f10) {
        (&pos)[lowPos - 1] = (&pos)[lowPos];
      }
      if ((&pos)[lowPos] == 0) {
        (&pos)[lowPos] = -0xf0f0f10;
      }
      else {
        (&pos)[lowPos] = (&pos)[lowPos] + -1;
        if ((uint)huffNode[(uint)(&pos)[lowPos]].nbBits != maxNbBits - lowPos) {
          (&pos)[lowPos] = -0xf0f0f10;
        }
      }
    }
    while (huffNode_local._4_4_ = maxNbBits, n < 0) {
      if (currentNbBits == 0xf0f0f0f0) {
        while (huffNode[(int)local_30].nbBits == maxNbBits) {
          local_30 = local_30 - 1;
        }
        huffNode[(int)(local_30 + 1)].nbBits = huffNode[(int)(local_30 + 1)].nbBits + 0xff;
        currentNbBits = local_30 + 1;
        n = n + 1;
      }
      else {
        huffNode[currentNbBits + 1].nbBits = huffNode[currentNbBits + 1].nbBits + 0xff;
        currentNbBits = currentNbBits + 1;
        n = n + 1;
      }
    }
  }
  return huffNode_local._4_4_;
}

Assistant:

static U32 HUF_setMaxHeight(nodeElt* huffNode, U32 lastNonNull, U32 maxNbBits)
{
    const U32 largestBits = huffNode[lastNonNull].nbBits;
    /* early exit : no elt > maxNbBits, so the tree is already valid. */
    if (largestBits <= maxNbBits) return largestBits;

    /* there are several too large elements (at least >= 2) */
    {   int totalCost = 0;
        const U32 baseCost = 1 << (largestBits - maxNbBits);
        int n = (int)lastNonNull;

        /* Adjust any ranks > maxNbBits to maxNbBits.
         * Compute totalCost, which is how far the sum of the ranks is
         * we are over 2^largestBits after adjust the offending ranks.
         */
        while (huffNode[n].nbBits > maxNbBits) {
            totalCost += baseCost - (1 << (largestBits - huffNode[n].nbBits));
            huffNode[n].nbBits = (BYTE)maxNbBits;
            n--;
        }
        /* n stops at huffNode[n].nbBits <= maxNbBits */
        assert(huffNode[n].nbBits <= maxNbBits);
        /* n end at index of smallest symbol using < maxNbBits */
        while (huffNode[n].nbBits == maxNbBits) --n;

        /* renorm totalCost from 2^largestBits to 2^maxNbBits
         * note : totalCost is necessarily a multiple of baseCost */
        assert((totalCost & (baseCost - 1)) == 0);
        totalCost >>= (largestBits - maxNbBits);
        assert(totalCost > 0);

        /* repay normalized cost */
        {   U32 const noSymbol = 0xF0F0F0F0;
            U32 rankLast[HUF_TABLELOG_MAX+2];

            /* Get pos of last (smallest = lowest cum. count) symbol per rank */
            ZSTD_memset(rankLast, 0xF0, sizeof(rankLast));
            {   U32 currentNbBits = maxNbBits;
                int pos;
                for (pos=n ; pos >= 0; pos--) {
                    if (huffNode[pos].nbBits >= currentNbBits) continue;
                    currentNbBits = huffNode[pos].nbBits;   /* < maxNbBits */
                    rankLast[maxNbBits-currentNbBits] = (U32)pos;
            }   }

            while (totalCost > 0) {
                /* Try to reduce the next power of 2 above totalCost because we
                 * gain back half the rank.
                 */
                U32 nBitsToDecrease = BIT_highbit32((U32)totalCost) + 1;
                for ( ; nBitsToDecrease > 1; nBitsToDecrease--) {
                    U32 const highPos = rankLast[nBitsToDecrease];
                    U32 const lowPos = rankLast[nBitsToDecrease-1];
                    if (highPos == noSymbol) continue;
                    /* Decrease highPos if no symbols of lowPos or if it is
                     * not cheaper to remove 2 lowPos than highPos.
                     */
                    if (lowPos == noSymbol) break;
                    {   U32 const highTotal = huffNode[highPos].count;
                        U32 const lowTotal = 2 * huffNode[lowPos].count;
                        if (highTotal <= lowTotal) break;
                }   }
                /* only triggered when no more rank 1 symbol left => find closest one (note : there is necessarily at least one !) */
                assert(rankLast[nBitsToDecrease] != noSymbol || nBitsToDecrease == 1);
                /* HUF_MAX_TABLELOG test just to please gcc 5+; but it should not be necessary */
                while ((nBitsToDecrease<=HUF_TABLELOG_MAX) && (rankLast[nBitsToDecrease] == noSymbol))
                    nBitsToDecrease++;
                assert(rankLast[nBitsToDecrease] != noSymbol);
                /* Increase the number of bits to gain back half the rank cost. */
                totalCost -= 1 << (nBitsToDecrease-1);
                huffNode[rankLast[nBitsToDecrease]].nbBits++;

                /* Fix up the new rank.
                 * If the new rank was empty, this symbol is now its smallest.
                 * Otherwise, this symbol will be the largest in the new rank so no adjustment.
                 */
                if (rankLast[nBitsToDecrease-1] == noSymbol)
                    rankLast[nBitsToDecrease-1] = rankLast[nBitsToDecrease];
                /* Fix up the old rank.
                 * If the symbol was at position 0, meaning it was the highest weight symbol in the tree,
                 * it must be the only symbol in its rank, so the old rank now has no symbols.
                 * Otherwise, since the Huffman nodes are sorted by count, the previous position is now
                 * the smallest node in the rank. If the previous position belongs to a different rank,
                 * then the rank is now empty.
                 */
                if (rankLast[nBitsToDecrease] == 0)    /* special case, reached largest symbol */
                    rankLast[nBitsToDecrease] = noSymbol;
                else {
                    rankLast[nBitsToDecrease]--;
                    if (huffNode[rankLast[nBitsToDecrease]].nbBits != maxNbBits-nBitsToDecrease)
                        rankLast[nBitsToDecrease] = noSymbol;   /* this rank is now empty */
                }
            }   /* while (totalCost > 0) */

            /* If we've removed too much weight, then we have to add it back.
             * To avoid overshooting again, we only adjust the smallest rank.
             * We take the largest nodes from the lowest rank 0 and move them
             * to rank 1. There's guaranteed to be enough rank 0 symbols because
             * TODO.
             */
            while (totalCost < 0) {  /* Sometimes, cost correction overshoot */
                /* special case : no rank 1 symbol (using maxNbBits-1);
                 * let's create one from largest rank 0 (using maxNbBits).
                 */
                if (rankLast[1] == noSymbol) {
                    while (huffNode[n].nbBits == maxNbBits) n--;
                    huffNode[n+1].nbBits--;
                    assert(n >= 0);
                    rankLast[1] = (U32)(n+1);
                    totalCost++;
                    continue;
                }
                huffNode[ rankLast[1] + 1 ].nbBits--;
                rankLast[1]++;
                totalCost ++;
            }
        }   /* repay normalized cost */
    }   /* there are several too large elements (at least >= 2) */

    return maxNbBits;
}